

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O0

size_t __thiscall
adios2::plugin::PluginOperator::InverseOperate
          (PluginOperator *this,char *bufferIn,size_t sizeIn,char *dataOut)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  pointer pIVar4;
  undefined4 extraout_var;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  size_t pluginSize;
  string *pluginLibrary;
  iterator paramPluginLibraryIt;
  string pluginName;
  iterator paramPluginNameIt;
  size_t offset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd18;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd60;
  allocator *paVar6;
  string *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  PluginOperator *in_stack_fffffffffffffd80;
  allocator local_231;
  string local_230 [8];
  unsigned_long *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  Operator *in_stack_fffffffffffffde8;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  _Self local_198;
  allocator local_189;
  string local_188 [32];
  _Self local_168;
  string local_160 [39];
  undefined1 local_139 [40];
  undefined1 local_111 [40];
  undefined1 local_e9 [40];
  undefined1 local_c1 [33];
  _Self local_a0 [3];
  allocator local_81;
  string local_80 [32];
  _Self local_60 [7];
  long local_28;
  undefined8 local_20;
  long local_18;
  long local_10;
  size_t sVar5;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  local_28 = 4;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::Operator::GetParameters<unsigned_long>
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xacde9e);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0xacdebb);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xacdec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"PluginName",&local_81);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffd18,(key_type *)0xacdf18);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xacdf57);
  local_a0[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffd18);
  bVar1 = std::operator==(local_60,local_a0);
  if (bVar1) {
    in_stack_fffffffffffffd80 = (PluginOperator *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_c1 + 1),"Plugins",(allocator *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd78 = (string *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_e9 + 1),"PluginOperator",(allocator *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd70 = (string *)local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_111 + 1),"InverseOperate",(allocator *)in_stack_fffffffffffffd70);
    in_stack_fffffffffffffd68 = (string *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_139 + 1),"PluginName could not be found in the plugin header",
               (allocator *)in_stack_fffffffffffffd68);
    helper::Throw<std::runtime_error>
              ((string *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,iVar2);
    std::__cxx11::string::~string((string *)(local_139 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_139);
    std::__cxx11::string::~string((string *)(local_111 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0xace208);
  std::__cxx11::string::string(local_160,(string *)&ppVar3->second);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xace22d);
  paVar6 = &local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"PluginLibrary",paVar6);
  iVar2 = (int)((ulong)paVar6 >> 0x20);
  local_168._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffd18,(key_type *)0xace271);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::
  unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
  ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                *)0xace2b0);
  local_198._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffd18);
  bVar1 = std::operator==(&local_168,&local_198);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"Plugins",&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e0,"PluginOperator",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"InverseOperate",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_230,"PluginLibrary could not be found in the plugin header",&local_231);
    helper::Throw<std::runtime_error>
              ((string *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,iVar2);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xace561);
  PluginInit(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  pIVar4 = std::
           unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           ::operator->((unique_ptr<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
                         *)0xace59a);
  iVar2 = (*(pIVar4->m_Plugin->super_Operator)._vptr_Operator[0x15])
                    (pIVar4->m_Plugin,local_10 + local_28,local_18 - local_28,local_20);
  sVar5 = CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string(local_160);
  return sVar5;
}

Assistant:

size_t PluginOperator::InverseOperate(const char *bufferIn, const size_t sizeIn, char *dataOut)
{
    size_t offset = 4; // skip 4 bytes for the common header

    // now handle plugin specific header
    m_Impl->m_PluginParams = GetParameters(bufferIn, offset);

    auto paramPluginNameIt = m_Impl->m_PluginParams.find("PluginName");
    if (paramPluginNameIt == m_Impl->m_PluginParams.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginOperator", "InverseOperate",
                                          "PluginName could not be found in the plugin header");
    }
    std::string pluginName = paramPluginNameIt->second;

    auto paramPluginLibraryIt = m_Impl->m_PluginParams.find("PluginLibrary");
    if (paramPluginLibraryIt == m_Impl->m_PluginParams.end())
    {
        helper::Throw<std::runtime_error>("Plugins", "PluginOperator", "InverseOperate",
                                          "PluginLibrary could not be found in the plugin header");
    }
    const std::string &pluginLibrary = paramPluginLibraryIt->second;

    // now set up the plugin if it hasn't already
    PluginInit(pluginName, pluginLibrary);

    // add offset to bufferIn, so plugin doesn't have to worry about plugin
    // header or common header
    size_t pluginSize =
        m_Impl->m_Plugin->InverseOperate(bufferIn + offset, sizeIn - offset, dataOut);
    return pluginSize;
}